

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixLock(sqlite3_file *id,int eFileLock)

{
  byte bVar1;
  sqlite3_io_methods *psVar2;
  short sVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  uint uVar10;
  int sqliteIOErr;
  char cVar11;
  flock local_48;
  
  iVar6 = (int)&local_48;
  iVar8 = (int)&local_48;
  sqliteIOErr = (int)&local_48;
  bVar4 = *(byte *)((long)&id[3].pMethods + 4);
  if (eFileLock <= (int)(uint)bVar4) {
    return 0;
  }
  psVar2 = id[2].pMethods;
  if ((sqlite3_mutex *)psVar2->xRead != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)psVar2->xRead);
    bVar4 = *(byte *)((long)&id[3].pMethods + 4);
  }
  bVar1 = *(byte *)&psVar2->xTruncate;
  iVar7 = 5;
  if (bVar4 == bVar1) {
    if (eFileLock == 1) goto LAB_0012d4e4;
    local_48.l_len = 1;
    local_48.l_whence = 0;
    if (eFileLock == 4) {
      sVar3 = 1;
      if (bVar4 < 3) goto LAB_0012d51c;
LAB_0012d56d:
      if (*(int *)&psVar2->xWrite < 2) {
        local_48.l_len = 0x1fe;
        uVar10 = 2;
        goto LAB_0012d5a7;
      }
      iVar7 = 5;
    }
    else {
LAB_0012d568:
      if (eFileLock == 4) goto LAB_0012d56d;
      local_48.l_len = 0x1fe;
      if (eFileLock == 2) {
        local_48.l_len = 1;
      }
      uVar10 = (eFileLock != 2) + 1;
LAB_0012d5a7:
      local_48.l_type = 1;
      local_48.l_start = (ulong)uVar10 + (long)sqlite3PendingByte;
      iVar6 = unixFileLock((unixFile *)id,&local_48);
      if (iVar6 == 0) goto LAB_0012d6a7;
      piVar9 = __errno_location();
      iVar6 = *piVar9;
      iVar7 = sqliteErrorFromPosixError(iVar6,iVar8);
      if (iVar7 != 5) {
        *(int *)&id[4].pMethods = iVar6;
      }
      if (eFileLock != 4) goto LAB_0012d6b3;
    }
    *(undefined1 *)((long)&id[3].pMethods + 4) = 3;
    *(undefined1 *)&psVar2->xTruncate = 3;
  }
  else {
    if (1 < (uint)eFileLock || 2 < bVar1) goto LAB_0012d6b3;
LAB_0012d4e4:
    if ((byte)(bVar1 - 1) < 2) {
      *(undefined1 *)((long)&id[3].pMethods + 4) = 1;
      psVar2->xWrite =
           (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)
           CONCAT44((int)((ulong)psVar2->xWrite >> 0x20) + 1,(int)psVar2->xWrite + 1);
    }
    else {
      sVar3 = 0;
LAB_0012d51c:
      local_48.l_type = sVar3;
      local_48.l_len = 1;
      local_48.l_whence = 0;
      cVar11 = (char)local_48.l_type;
      local_48.l_start = (__off64_t)sqlite3PendingByte;
      iVar5 = unixFileLock((unixFile *)id,&local_48);
      if (iVar5 != 0) {
        piVar9 = __errno_location();
        iVar8 = *piVar9;
        iVar6 = sqliteErrorFromPosixError(iVar8,iVar6);
        if (iVar6 != 5) {
          *(int *)&id[4].pMethods = iVar8;
          iVar7 = iVar6;
        }
        goto LAB_0012d6b3;
      }
      if (cVar11 != '\0') goto LAB_0012d568;
      local_48.l_start = (long)sqlite3PendingByte + 2;
      local_48.l_len = 0x1fe;
      iVar6 = unixFileLock((unixFile *)id,&local_48);
      if (iVar6 == 0) {
        iVar7 = 0;
        iVar6 = 0;
      }
      else {
        piVar9 = __errno_location();
        iVar6 = *piVar9;
        iVar7 = sqliteErrorFromPosixError(iVar6,sqliteIOErr);
      }
      local_48.l_start = (__off64_t)sqlite3PendingByte;
      local_48.l_len = 1;
      local_48.l_type = 2;
      iVar8 = unixFileLock((unixFile *)id,&local_48);
      if (iVar7 == 0 && iVar8 != 0) {
        piVar9 = __errno_location();
        iVar6 = *piVar9;
        iVar7 = 0x80a;
LAB_0012d693:
        *(int *)&id[4].pMethods = iVar6;
        goto LAB_0012d6b3;
      }
      if (iVar7 != 0) {
        if (iVar7 == 5) goto LAB_0012d6b3;
        goto LAB_0012d693;
      }
      piVar9 = (int *)((long)&psVar2->xWrite + 4);
      *piVar9 = *piVar9 + 1;
      *(undefined4 *)&psVar2->xWrite = 1;
LAB_0012d6a7:
      *(char *)((long)&id[3].pMethods + 4) = (char)eFileLock;
      *(char *)&psVar2->xTruncate = (char)eFileLock;
    }
    iVar7 = 0;
  }
LAB_0012d6b3:
  if ((sqlite3_mutex *)psVar2->xRead != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)psVar2->xRead);
  }
  return iVar7;
}

Assistant:

static int unixLock(sqlite3_file *id, int eFileLock){
  /* The following describes the implementation of the various locks and
  ** lock transitions in terms of the POSIX advisory shared and exclusive
  ** lock primitives (called read-locks and write-locks below, to avoid
  ** confusion with SQLite lock names). The algorithms are complicated
  ** slightly in order to be compatible with Windows95 systems simultaneously
  ** accessing the same database file, in case that is ever required.
  **
  ** Symbols defined in os.h indentify the 'pending byte' and the 'reserved
  ** byte', each single bytes at well known offsets, and the 'shared byte
  ** range', a range of 510 bytes at a well known offset.
  **
  ** To obtain a SHARED lock, a read-lock is obtained on the 'pending
  ** byte'.  If this is successful, 'shared byte range' is read-locked
  ** and the lock on the 'pending byte' released.  (Legacy note:  When
  ** SQLite was first developed, Windows95 systems were still very common,
  ** and Widnows95 lacks a shared-lock capability.  So on Windows95, a
  ** single randomly selected by from the 'shared byte range' is locked.
  ** Windows95 is now pretty much extinct, but this work-around for the
  ** lack of shared-locks on Windows95 lives on, for backwards
  ** compatibility.)
  **
  ** A process may only obtain a RESERVED lock after it has a SHARED lock.
  ** A RESERVED lock is implemented by grabbing a write-lock on the
  ** 'reserved byte'. 
  **
  ** A process may only obtain a PENDING lock after it has obtained a
  ** SHARED lock. A PENDING lock is implemented by obtaining a write-lock
  ** on the 'pending byte'. This ensures that no new SHARED locks can be
  ** obtained, but existing SHARED locks are allowed to persist. A process
  ** does not have to obtain a RESERVED lock on the way to a PENDING lock.
  ** This property is used by the algorithm for rolling back a journal file
  ** after a crash.
  **
  ** An EXCLUSIVE lock, obtained after a PENDING lock is held, is
  ** implemented by obtaining a write-lock on the entire 'shared byte
  ** range'. Since all other locks require a read-lock on one of the bytes
  ** within this range, this ensures that no other locks are held on the
  ** database. 
  */
  int rc = SQLITE_OK;
  unixFile *pFile = (unixFile*)id;
  unixInodeInfo *pInode;
  struct flock lock;
  int tErrno = 0;

  assert( pFile );
  OSTRACE(("LOCK    %d %s was %s(%s,%d) pid=%d (unix)\n", pFile->h,
      azFileLock(eFileLock), azFileLock(pFile->eFileLock),
      azFileLock(pFile->pInode->eFileLock), pFile->pInode->nShared,
      osGetpid(0)));

  /* If there is already a lock of this type or more restrictive on the
  ** unixFile, do nothing. Don't use the end_lock: exit path, as
  ** unixEnterMutex() hasn't been called yet.
  */
  if( pFile->eFileLock>=eFileLock ){
    OSTRACE(("LOCK    %d %s ok (already held) (unix)\n", pFile->h,
            azFileLock(eFileLock)));
    return SQLITE_OK;
  }

  /* Make sure the locking sequence is correct.
  **  (1) We never move from unlocked to anything higher than shared lock.
  **  (2) SQLite never explicitly requests a pendig lock.
  **  (3) A shared lock is always held when a reserve lock is requested.
  */
  assert( pFile->eFileLock!=NO_LOCK || eFileLock==SHARED_LOCK );
  assert( eFileLock!=PENDING_LOCK );
  assert( eFileLock!=RESERVED_LOCK || pFile->eFileLock==SHARED_LOCK );

  /* This mutex is needed because pFile->pInode is shared across threads
  */
  pInode = pFile->pInode;
  sqlite3_mutex_enter(pInode->pLockMutex);

  /* If some thread using this PID has a lock via a different unixFile*
  ** handle that precludes the requested lock, return BUSY.
  */
  if( (pFile->eFileLock!=pInode->eFileLock && 
          (pInode->eFileLock>=PENDING_LOCK || eFileLock>SHARED_LOCK))
  ){
    rc = SQLITE_BUSY;
    goto end_lock;
  }

  /* If a SHARED lock is requested, and some thread using this PID already
  ** has a SHARED or RESERVED lock, then increment reference counts and
  ** return SQLITE_OK.
  */
  if( eFileLock==SHARED_LOCK && 
      (pInode->eFileLock==SHARED_LOCK || pInode->eFileLock==RESERVED_LOCK) ){
    assert( eFileLock==SHARED_LOCK );
    assert( pFile->eFileLock==0 );
    assert( pInode->nShared>0 );
    pFile->eFileLock = SHARED_LOCK;
    pInode->nShared++;
    pInode->nLock++;
    goto end_lock;
  }


  /* A PENDING lock is needed before acquiring a SHARED lock and before
  ** acquiring an EXCLUSIVE lock.  For the SHARED lock, the PENDING will
  ** be released.
  */
  lock.l_len = 1L;
  lock.l_whence = SEEK_SET;
  if( eFileLock==SHARED_LOCK 
      || (eFileLock==EXCLUSIVE_LOCK && pFile->eFileLock<PENDING_LOCK)
  ){
    lock.l_type = (eFileLock==SHARED_LOCK?F_RDLCK:F_WRLCK);
    lock.l_start = PENDING_BYTE;
    if( unixFileLock(pFile, &lock) ){
      tErrno = errno;
      rc = sqliteErrorFromPosixError(tErrno, SQLITE_IOERR_LOCK);
      if( rc!=SQLITE_BUSY ){
        storeLastErrno(pFile, tErrno);
      }
      goto end_lock;
    }
  }


  /* If control gets to this point, then actually go ahead and make
  ** operating system calls for the specified lock.
  */
  if( eFileLock==SHARED_LOCK ){
    assert( pInode->nShared==0 );
    assert( pInode->eFileLock==0 );
    assert( rc==SQLITE_OK );

    /* Now get the read-lock */
    lock.l_start = SHARED_FIRST;
    lock.l_len = SHARED_SIZE;
    if( unixFileLock(pFile, &lock) ){
      tErrno = errno;
      rc = sqliteErrorFromPosixError(tErrno, SQLITE_IOERR_LOCK);
    }

    /* Drop the temporary PENDING lock */
    lock.l_start = PENDING_BYTE;
    lock.l_len = 1L;
    lock.l_type = F_UNLCK;
    if( unixFileLock(pFile, &lock) && rc==SQLITE_OK ){
      /* This could happen with a network mount */
      tErrno = errno;
      rc = SQLITE_IOERR_UNLOCK; 
    }

    if( rc ){
      if( rc!=SQLITE_BUSY ){
        storeLastErrno(pFile, tErrno);
      }
      goto end_lock;
    }else{
      pFile->eFileLock = SHARED_LOCK;
      pInode->nLock++;
      pInode->nShared = 1;
    }
  }else if( eFileLock==EXCLUSIVE_LOCK && pInode->nShared>1 ){
    /* We are trying for an exclusive lock but another thread in this
    ** same process is still holding a shared lock. */
    rc = SQLITE_BUSY;
  }else{
    /* The request was for a RESERVED or EXCLUSIVE lock.  It is
    ** assumed that there is a SHARED or greater lock on the file
    ** already.
    */
    assert( 0!=pFile->eFileLock );
    lock.l_type = F_WRLCK;

    assert( eFileLock==RESERVED_LOCK || eFileLock==EXCLUSIVE_LOCK );
    if( eFileLock==RESERVED_LOCK ){
      lock.l_start = RESERVED_BYTE;
      lock.l_len = 1L;
    }else{
      lock.l_start = SHARED_FIRST;
      lock.l_len = SHARED_SIZE;
    }

    if( unixFileLock(pFile, &lock) ){
      tErrno = errno;
      rc = sqliteErrorFromPosixError(tErrno, SQLITE_IOERR_LOCK);
      if( rc!=SQLITE_BUSY ){
        storeLastErrno(pFile, tErrno);
      }
    }
  }
  

#ifdef SQLITE_DEBUG
  /* Set up the transaction-counter change checking flags when
  ** transitioning from a SHARED to a RESERVED lock.  The change
  ** from SHARED to RESERVED marks the beginning of a normal
  ** write operation (not a hot journal rollback).
  */
  if( rc==SQLITE_OK
   && pFile->eFileLock<=SHARED_LOCK
   && eFileLock==RESERVED_LOCK
  ){
    pFile->transCntrChng = 0;
    pFile->dbUpdate = 0;
    pFile->inNormalWrite = 1;
  }
#endif


  if( rc==SQLITE_OK ){
    pFile->eFileLock = eFileLock;
    pInode->eFileLock = eFileLock;
  }else if( eFileLock==EXCLUSIVE_LOCK ){
    pFile->eFileLock = PENDING_LOCK;
    pInode->eFileLock = PENDING_LOCK;
  }

end_lock:
  sqlite3_mutex_leave(pInode->pLockMutex);
  OSTRACE(("LOCK    %d %s %s (unix)\n", pFile->h, azFileLock(eFileLock), 
      rc==SQLITE_OK ? "ok" : "failed"));
  return rc;
}